

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O2

void __thiscall Menu::display(Menu *this)

{
  long lVar1;
  ostream *poVar2;
  reference pvVar3;
  int i;
  ulong __n;
  
  line(0x23,'-');
  lVar1 = std::cout;
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar1 + -0x18)) =
       0x23;
  poVar2 = std::operator<<(&std::cout,0x20);
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::endl<char,std::char_traits<char>>(poVar2);
  line(0x23,'-');
  for (__n = 1; __n < (ulong)((long)(this->options).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->options).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6); __n = __n + 1)
  {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)__n);
    poVar2 = std::operator<<(poVar2,". ");
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
             ::at(&this->options,__n);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<(poVar2,"0. ");
  pvVar3 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_()>_>_>_>
           ::at(&this->options,0);
  poVar2 = std::operator<<(poVar2,(string *)pvVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void Menu::display() {
    line(35);
    cout << left << setw(35) << setfill(' ') << name << endl;
    line(35);
    for (int i = 1; i < options.size(); i++) {
        cout << i << ". " << options.at(i).first << endl;
    }
    // Por convenção, a opção 0 é sempre fechar/voltar
    cout << endl << "0. " << options.at(0).first << endl;
}